

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O3

StepStatus __thiscall
adios2::core::engine::DataManWriter::BeginStep(DataManWriter *this,StepMode mode,float timeout_sec)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  char cVar6;
  string __str;
  string local_90;
  string local_70;
  string local_50;
  ulong __val;
  
  this->m_CurrentStep = this->m_CurrentStep + 1;
  if (this->m_CombinedSteps == 0) {
    adios2::format::DataManSerializer::NewWriterBuffer
              (&this->m_Serializer,this->m_SerializerBufferSize);
  }
  if (this->m_MonitorActive == true) {
    DataManMonitor::BeginStep(&this->m_Monitor,this->m_CurrentStep);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Engine","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DataManWriter","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BeginStep","");
  iVar3 = (*(this->super_Engine)._vptr_Engine[4])(this);
  __val = CONCAT44(extraout_var,iVar3);
  cVar6 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar2 = '\x04';
    do {
      cVar6 = cVar2;
      if (uVar5 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_006a45a1;
      }
      if (uVar5 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_006a45a1;
      }
      if (uVar5 < 10000) goto LAB_006a45a1;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar2 = cVar6 + '\x04';
    } while (bVar1);
    cVar6 = cVar6 + '\x01';
  }
LAB_006a45a1:
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,__val);
  iVar3 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_50,&local_70,&local_90,&__str,0,iVar3,5,this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  adios2::format::DataManSerializer::AttachTimeStamp(&this->m_Serializer,lVar4 / 1000000);
  return OK;
}

Assistant:

StepStatus DataManWriter::BeginStep(StepMode mode, const float timeout_sec)
{
    ++m_CurrentStep;
    if (m_CombinedSteps == 0)
    {
        m_Serializer.NewWriterBuffer(m_SerializerBufferSize);
    }

    if (m_MonitorActive)
    {
        m_Monitor.BeginStep(m_CurrentStep);
    }

    helper::Log("Engine", "DataManWriter", "BeginStep", std::to_string(CurrentStep()), 0,
                m_Comm.Rank(), 5, m_Verbosity, helper::LogMode::INFO);

    m_Serializer.AttachTimeStamp(std::chrono::duration_cast<std::chrono::milliseconds>(
                                     std::chrono::system_clock::now().time_since_epoch())
                                     .count());

    return StepStatus::OK;
}